

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tn93_shared.cc
# Opt level: O2

void addASequenceToList(StringBuffer *sequences,Vector *seqLengths,long *firstSequenceLength,
                       StringBuffer *names,Vector *nameLengths)

{
  long lVar1;
  ostream *poVar2;
  char *pcVar3;
  
  StringBuffer::appendChar(sequences,'\0');
  Vector::appendValue(seqLengths,sequences->sLength);
  if (seqLengths->vLength == 2) {
    lVar1 = stringLength(seqLengths,0);
    *firstSequenceLength = lVar1;
    if (0 < lVar1) {
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"First sequence length must be positive.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    lVar1 = stringLength(seqLengths,seqLengths->vLength - 2);
    if (lVar1 == *firstSequenceLength) {
      return;
    }
    poVar2 = std::operator<<((ostream *)&std::cerr,"All sequences must have the same length (");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,*firstSequenceLength);
    poVar2 = std::operator<<(poVar2,"), but sequence \'");
    pcVar3 = stringText(names,nameLengths,nameLengths->vLength - 2);
    poVar2 = std::operator<<(poVar2,pcVar3);
    poVar2 = std::operator<<(poVar2,"\' had length ");
    lVar1 = stringLength(seqLengths,seqLengths->vLength - 2);
    std::ostream::operator<<(poVar2,lVar1);
  }
  exit(1);
}

Assistant:

void addASequenceToList (StringBuffer& sequences, Vector& seqLengths, long &firstSequenceLength, StringBuffer& names, Vector& nameLengths)
{
  sequences.appendChar ('\0');
  seqLengths.appendValue (sequences.length());
  if (seqLengths.length() == 2)
      {
    firstSequenceLength = stringLength (seqLengths, 0);
    
    if (firstSequenceLength <= 0)
        {
      cerr << "First sequence length must be positive." << endl;
      exit (1);
        }
      }
  else
      {
    if (stringLength (seqLengths, seqLengths.length()-2) != firstSequenceLength)
        {
      cerr << "All sequences must have the same length (" << firstSequenceLength << "), but sequence '" << stringText (names, nameLengths, nameLengths.length()-2) << "' had length " << stringLength (seqLengths, seqLengths.length()-2);
      exit (1);
        }
      }
}